

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall spoa::Graph::Edge::AddSequence(Edge *this,uint32_t label,uint32_t w)

{
  uint local_14;
  
  std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->labels,&local_14);
  this->weight = this->weight + (ulong)w;
  return;
}

Assistant:

void Graph::Edge::AddSequence(std::uint32_t label, std::uint32_t w) {
  labels.emplace_back(label);
  weight += w;
}